

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void sync_write(AV1LfSync *lf_sync,int r,int c,int sb_cols,int plane)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int sig;
  int cur;
  int nsync;
  int local_28;
  int local_20;
  
  bVar1 = in_ECX + -1 <= in_EDX;
  local_20 = in_EDX;
  if (bVar1) {
    local_20 = in_ECX + *(int *)(in_RDI + 0x48);
  }
  if (bVar1 || in_EDX % *(int *)(in_RDI + 0x48) == 0) {
    pthread_mutex_lock((pthread_mutex_t *)
                       (*(long *)(in_RDI + (long)in_R8D * 8) + (long)in_ESI * 0x28));
    if (local_20 < *(int *)(*(long *)(in_RDI + 0x30 + (long)in_R8D * 8) + (long)in_ESI * 4)) {
      local_28 = *(int *)(*(long *)(in_RDI + 0x30 + (long)in_R8D * 8) + (long)in_ESI * 4);
    }
    else {
      local_28 = local_20;
    }
    *(int *)(*(long *)(in_RDI + 0x30 + (long)in_R8D * 8) + (long)in_ESI * 4) = local_28;
    pthread_cond_broadcast
              ((pthread_cond_t *)(*(long *)(in_RDI + 0x18 + (long)in_R8D * 8) + (long)in_ESI * 0x30)
              );
    pthread_mutex_unlock
              ((pthread_mutex_t *)(*(long *)(in_RDI + (long)in_R8D * 8) + (long)in_ESI * 0x28));
  }
  return;
}

Assistant:

static inline void sync_write(AV1DecRowMTSync *const dec_row_mt_sync, int r,
                              int c, const int sb_cols) {
#if CONFIG_MULTITHREAD
  const int nsync = dec_row_mt_sync->sync_range;
  int cur;
  int sig = 1;

  if (c < sb_cols - 1) {
    cur = c;
    if (c % nsync) sig = 0;
  } else {
    cur = sb_cols + nsync + dec_row_mt_sync->intrabc_extra_top_right_sb_delay;
  }

  if (sig) {
    pthread_mutex_lock(&dec_row_mt_sync->mutex_[r]);

    dec_row_mt_sync->cur_sb_col[r] = cur;

    pthread_cond_signal(&dec_row_mt_sync->cond_[r]);
    pthread_mutex_unlock(&dec_row_mt_sync->mutex_[r]);
  }
#else
  (void)dec_row_mt_sync;
  (void)r;
  (void)c;
  (void)sb_cols;
#endif  // CONFIG_MULTITHREAD
}